

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::relative_path(path *__return_storage_ptr__,path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  root_name_length(this);
  root_name_length(this);
  std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
  paVar1 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
  if (local_38._M_p == &local_28) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p = local_38._M_p;
    (__return_storage_ptr__->_path).field_2._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  (__return_storage_ptr__->_path)._M_string_length = local_30;
  local_30 = 0;
  local_28 = '\0';
  local_38._M_p = &local_28;
  postprocess_path_with_format(__return_storage_ptr__,(format)this);
  if (local_38._M_p != &local_28) {
    operator_delete(local_38._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return path(_path.substr((std::min)(rootPathLen, _path.length())), generic_format);
}